

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetScrollHereX(float center_x_ratio)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  pIVar2 = GImGui->CurrentWindow;
  fVar1 = (pIVar2->WindowPadding).x;
  fVar4 = (GImGui->Style).ItemSpacing.x;
  uVar3 = -(uint)(fVar4 <= fVar1);
  fVar5 = (float)(~uVar3 & (uint)fVar4 | uVar3 & (uint)fVar1);
  fVar4 = (GImGui->LastItemData).Rect.Min.x - fVar5;
  (pIVar2->ScrollTarget).x =
       (float)(int)((((((GImGui->LastItemData).Rect.Max.x + fVar5) - fVar4) * center_x_ratio + fVar4
                     ) - (pIVar2->Pos).x) + (pIVar2->Scroll).x);
  (pIVar2->ScrollTargetCenterRatio).x = center_x_ratio;
  (pIVar2->ScrollTargetEdgeSnapDist).x =
       (float)(~-(uint)(fVar1 - fVar5 <= 0.0) & (uint)(fVar1 - fVar5));
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = ImMax(window->WindowPadding.x, g.Style.ItemSpacing.x);
    float target_pos_x = ImLerp(g.LastItemData.Rect.Min.x - spacing_x, g.LastItemData.Rect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}